

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

void __thiscall
perfetto::internal::DataSourceInstanceThreadLocalState::Reset
          (DataSourceInstanceThreadLocalState *this)

{
  _Head_base<0UL,_perfetto::TraceWriterBase_*,_false> _Var1;
  
  _Var1._M_head_impl =
       (this->trace_writer)._M_t.
       super___uniq_ptr_impl<perfetto::TraceWriterBase,_std::default_delete<perfetto::TraceWriterBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::TraceWriterBase_*,_std::default_delete<perfetto::TraceWriterBase>_>
       .super__Head_base<0UL,_perfetto::TraceWriterBase_*,_false>._M_head_impl;
  (this->trace_writer)._M_t.
  super___uniq_ptr_impl<perfetto::TraceWriterBase,_std::default_delete<perfetto::TraceWriterBase>_>.
  _M_t.
  super__Tuple_impl<0UL,_perfetto::TraceWriterBase_*,_std::default_delete<perfetto::TraceWriterBase>_>
  .super__Head_base<0UL,_perfetto::TraceWriterBase_*,_false>._M_head_impl = (TraceWriterBase *)0x0;
  if (_Var1._M_head_impl != (TraceWriterBase *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_TraceWriterBase[1])();
  }
  ::std::__uniq_ptr_impl<void,_void_(*)(void_*)>::reset
            ((__uniq_ptr_impl<void,_void_(*)(void_*)> *)&this->incremental_state,(pointer)0x0);
  ::std::__uniq_ptr_impl<void,_void_(*)(void_*)>::reset
            ((__uniq_ptr_impl<void,_void_(*)(void_*)> *)&this->data_source_custom_tls,(pointer)0x0);
  this->data_source_instance_id = 0;
  this->is_intercepted = false;
  this->incremental_state_generation = 0;
  this->muxer_id_for_testing = 0;
  this->backend_id = 0;
  *(undefined8 *)((long)&this->backend_id + 6) = 0;
  return;
}

Assistant:

void Reset() {
    trace_writer.reset();
    incremental_state.reset();
    data_source_custom_tls.reset();
    muxer_id_for_testing = 0;
    backend_id = 0;
    backend_connection_id = 0;
    buffer_id = 0;
    data_source_instance_id = 0;
    incremental_state_generation = 0;
    is_intercepted = false;
  }